

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O1

void __thiscall
CLIntercept::callLoggingExit
          (CLIntercept *this,char *functionName,cl_int errorCode,cl_event *event,
          cl_sync_point_khr *syncPoint,char *formatStr,...)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char in_AL;
  int iVar2;
  uint uVar3;
  long *plVar4;
  undefined8 uVar5;
  size_type *psVar6;
  undefined4 in_XMM0_Da;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar7;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar8;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  string str;
  va_list args;
  string local_170;
  pthread_mutex_t *local_150;
  string local_148;
  undefined8 local_128;
  string *local_120;
  undefined1 *local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  undefined1 local_e8 [48];
  undefined4 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Da;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_150 = (pthread_mutex_t *)&this->m_Mutex;
  iVar2 = pthread_mutex_lock(local_150);
  if (iVar2 != 0) {
    uVar5 = std::__throw_system_error(iVar2);
    if (local_148._M_dataplus._M_p != functionName) {
      operator_delete(local_148._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p);
    }
    pthread_mutex_unlock(local_150);
    _Unwind_Resume(uVar5);
  }
  local_118 = local_e8;
  local_120 = &str;
  local_128 = 0x3000000030;
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  local_170._M_string_length = 0;
  local_170.field_2._M_local_buf[0] = '\0';
  getCallLoggingPrefix(this,&local_170);
  std::__cxx11::string::append((char *)&local_170);
  if (event != (cl_event *)0x0) {
    snprintf(this->m_StringBuffer,0x4000," created event = %p",*event);
    std::__cxx11::string::append((char *)&local_170);
  }
  if (syncPoint != (cl_sync_point_khr *)0x0) {
    snprintf(this->m_StringBuffer,0x4000," is sync point = %u",(ulong)*syncPoint);
    std::__cxx11::string::append((char *)&local_170);
  }
  uVar3 = vsnprintf(this->m_StringBuffer,0x4000,formatStr,&local_128);
  if (uVar3 < 0x4000) {
    std::__cxx11::string::append((char *)&local_170);
  }
  std::__cxx11::string::append((char *)&local_170);
  std::__cxx11::string::append((char *)&local_170);
  CEnumNameMap::name_abi_cxx11_(&local_148,&this->m_EnumNameMap,errorCode);
  std::__cxx11::string::_M_append((char *)&local_170,(ulong)local_148._M_dataplus._M_p);
  paVar1 = &local_148.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != paVar1) {
    operator_delete(local_148._M_dataplus._M_p);
  }
  std::operator+(&local_108,"<<<< ",&local_170);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_108);
  psVar6 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    uVar7 = (undefined4)*psVar6;
    uVar8 = *(undefined4 *)((long)plVar4 + 0x14);
    local_148.field_2._M_allocated_capacity = *psVar6;
    local_148.field_2._8_4_ = (undefined4)plVar4[3];
    local_148.field_2._12_4_ = *(undefined4 *)((long)plVar4 + 0x1c);
    local_148._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_148.field_2._M_allocated_capacity = *psVar6;
    uVar7 = extraout_XMM0_Da;
    uVar8 = extraout_XMM0_Db;
    local_148._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_148._M_string_length = plVar4[1];
  *plVar4 = (long)psVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  log(this,(double)CONCAT44(uVar8,uVar7));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != paVar1) {
    operator_delete(local_148._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  pthread_mutex_unlock(local_150);
  return;
}

Assistant:

void CLIntercept::callLoggingExit(
    const char* functionName,
    const cl_int errorCode,
    const cl_event* event,
    const cl_sync_point_khr* syncPoint,
    const char* formatStr,
    ... )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    va_list args;
    va_start( args, formatStr );

    std::string str;
    getCallLoggingPrefix( str );

    str += functionName;

    if( event )
    {
        CLI_SPRINTF( m_StringBuffer, CLI_STRING_BUFFER_SIZE, " created event = %p", *event );
        str += m_StringBuffer;
    }
    if( syncPoint )
    {
        CLI_SPRINTF( m_StringBuffer, CLI_STRING_BUFFER_SIZE, " is sync point = %u", *syncPoint );
        str += m_StringBuffer;
    }

    int size = CLI_VSPRINTF( m_StringBuffer, CLI_STRING_BUFFER_SIZE, formatStr, args );
    if( size >= 0 && size < CLI_STRING_BUFFER_SIZE )
    {
        str += ": ";
        str += m_StringBuffer;
    }
    else
    {
        str += ": too long";
    }

    str += " -> ";
    str += m_EnumNameMap.name( errorCode );

    log( "<<<< " + str + "\n" );

    va_end( args );
}